

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::clear(FileLog *this)

{
  _Ios_Openmode _Var1;
  FileLog *this_local;
  
  std::ofstream::close();
  std::ofstream::close();
  _Var1 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&this->m_messages,_Var1);
  _Var1 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&this->m_event,_Var1);
  return;
}

Assistant:

void FileLog::clear()
{
  m_messages.close();
  m_event.close();

  m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::trunc );
  m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::trunc );
}